

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.h
# Opt level: O2

bool __thiscall
wallet::WalletBatch::EraseIC<std::pair<std::__cxx11::string,CScript>>
          (WalletBatch *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CScript>
          *key)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = DatabaseBatch::Erase<std::pair<std::__cxx11::string,CScript>>
                    ((this->m_batch)._M_t.
                     super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                     .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,key);
  if (bVar2) {
    (*this->m_database->_vptr_WalletDatabase[10])();
    if ((this->m_database->nUpdateCounter).super___atomic_base<unsigned_int>._M_i % 1000 == 0) {
      (*((this->m_batch)._M_t.
         super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
         _M_t.
         super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
         .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)->_vptr_DatabaseBatch
        [6])();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool EraseIC(const K& key)
    {
        if (!m_batch->Erase(key)) {
            return false;
        }
        m_database.IncrementUpdateCounter();
        if (m_database.nUpdateCounter % 1000 == 0) {
            m_batch->Flush();
        }
        return true;
    }